

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic_logger.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e550::BasicLoggerThreadNameFixture::~BasicLoggerThreadNameFixture
          (BasicLoggerThreadNameFixture *this)

{
  BasicLoggerThreadNameFixture *this_local;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__BasicLoggerThreadNameFixture_003cce70;
  pstore::
  no_ex_escape<(anonymous_namespace)::BasicLoggerThreadNameFixture::~BasicLoggerThreadNameFixture()::__0>
            ((anon_class_8_1_8991fb9c)this);
  std::__cxx11::string::~string((string *)&this->old_name_);
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

BasicLoggerThreadNameFixture::~BasicLoggerThreadNameFixture () {
        pstore::no_ex_escape ([this] () { pstore::threads::set_name (old_name_.c_str ()); });
    }